

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ListBoxFooter(void)

{
  ImGuiWindow *pIVar1;
  ImGuiStyle *pIVar2;
  ImRect bb;
  ImRect local_28;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  pIVar1 = pIVar1->ParentWindow;
  local_28.Min = (pIVar1->DC).LastItemRect.Min;
  local_28.Max = (pIVar1->DC).LastItemRect.Max;
  pIVar2 = GetStyle();
  EndChildFrame();
  SameLine(0.0,-1.0);
  (pIVar1->DC).CursorPos = local_28.Min;
  ItemSize(&local_28,(pIVar2->FramePadding).y);
  EndGroup();
  return;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}